

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O3

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs> *
__thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastInstancesIterator::next
          (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Rhs>
           *__return_storage_ptr__,FastInstancesIterator *this)

{
  Renaming *this_00;
  TermList t;
  TypedTermList term;
  bool bVar1;
  int iVar2;
  Rhs *pRVar3;
  ResultSubstitution *pRVar4;
  RefCounter *pRVar5;
  Renaming normalizer;
  undefined8 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 extraout_var;
  
  do {
    iVar2 = (*((this->_ldIterator)._core)->_vptr_IteratorCore[2])();
    if ((char)iVar2 != '\0') break;
    bVar1 = findNextLeaf(this);
  } while (bVar1);
  iVar2 = (*((this->_ldIterator)._core)->_vptr_IteratorCore[3])();
  pRVar3 = (Rhs *)CONCAT44(extraout_var,iVar2);
  if (this->_retrieveSubstitution == true) {
    this_00 = &this->_resultDenormalizer;
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
              (&this_00->_data);
    (this->_resultDenormalizer)._nextVar = 0;
    (this->_resultDenormalizer)._identity = true;
    term._sort._content._0_4_ = in_stack_ffffffffffffffa0;
    term.super_TermList._content = in_stack_ffffffffffffff98;
    term._sort._content._4_4_ = in_stack_ffffffffffffffa4;
    bVar1 = isGround(term);
    if (!bVar1) {
      t._content = (pRVar3->term)._sort._content;
      Kernel::Renaming::normalizeVariables
                ((Renaming *)&stack0xffffffffffffffa0,
                 (TermList)(pRVar3->term).super_TermList._content);
      Kernel::Renaming::normalizeVariables((Renaming *)&stack0xffffffffffffffa0,t);
      Kernel::Renaming::makeInverse(this_00,(Renaming *)&stack0xffffffffffffffa0);
      Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
                ((DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash> *)
                 &stack0xffffffffffffffa0);
    }
    pRVar4 = (ResultSubstitution *)
             Lib::FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    pRVar4->_vptr_ResultSubstitution = (_func_int **)&PTR__ResultSubstitution_00b2b568;
    pRVar4[1]._vptr_ResultSubstitution = (_func_int **)&this->_subst;
    pRVar4[2]._vptr_ResultSubstitution = (_func_int **)this_00;
    pRVar5 = (RefCounter *)
             Lib::FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    (__return_storage_ptr__->unifier)._obj = pRVar4;
    (__return_storage_ptr__->unifier)._refCnt = pRVar5;
    __return_storage_ptr__->data = pRVar3;
    pRVar5->_val = 1;
  }
  else {
    (__return_storage_ptr__->unifier)._obj = (ResultSubstitution *)0x0;
    (__return_storage_ptr__->unifier)._refCnt = (RefCounter *)0x0;
    __return_storage_ptr__->data = pRVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

QueryRes<ResultSubstitutionSP, LeafData_> SubstitutionTree<LeafData_>::FastInstancesIterator::next()
{
  while(!_ldIterator.hasNext() && findNextLeaf()) {}
  ASS(_ldIterator.hasNext());
  auto ld = _ldIterator.next();

  if(_retrieveSubstitution) {
    _resultDenormalizer.reset();
    bool ground = SubstitutionTree::isGround(ld->key());
    if(!ground) {
      Renaming normalizer;
      normalizer.normalizeVariables(ld->key());
      _resultDenormalizer.makeInverse(normalizer);
    }

    return QueryRes(_subst.getSubstitution(&_resultDenormalizer), ld);
  } else {
    return QueryRes(ResultSubstitutionSP(), ld);
  }
}